

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute_iterator * __thiscall
pugi::xml_attribute_iterator::operator--(xml_attribute_iterator *this)

{
  xml_attribute_struct *local_18;
  xml_attribute_iterator *this_local;
  
  if ((this->_wrap)._attr == (xml_attribute_struct *)0x0) {
    local_18 = (xml_attribute_struct *)xml_node::last_attribute(&this->_parent);
  }
  else {
    local_18 = (xml_attribute_struct *)xml_attribute::previous_attribute(&this->_wrap);
  }
  (this->_wrap)._attr = local_18;
  return this;
}

Assistant:

PUGI__FN const xml_attribute_iterator& xml_attribute_iterator::operator--()
	{
		_wrap = _wrap._attr ? _wrap.previous_attribute() : _parent.last_attribute();
		return *this;
	}